

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboTestUtil::GradientShader::shadeFragments
          (GradientShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  float *pfVar1;
  int iVar2;
  pointer pUVar3;
  GenericVec4 *pGVar4;
  long lVar5;
  ulong uVar6;
  int fragNdx;
  int fragNdx_00;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec4 color;
  Vec4 coord;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 local_98;
  float local_88;
  float local_84;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (0 < numPackets) {
    pUVar3 = (this->super_ShaderProgram).m_uniforms.
             super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_68 = (pUVar3->value).f;
    fStack_64 = (pUVar3->value).f4[1];
    fStack_60 = (pUVar3->value).f4[2];
    fStack_5c = (pUVar3->value).f4[3];
    local_78 = pUVar3[1].value.f - local_68;
    fStack_74 = pUVar3[1].value.f4[1] - fStack_64;
    fStack_70 = pUVar3[1].value.f4[2] - fStack_60;
    fStack_6c = pUVar3[1].value.f4[3] - fStack_5c;
    iVar7 = 0;
    uVar6 = 0;
    do {
      fragNdx_00 = 0;
      do {
        rr::readTriangleVarying<float>((rr *)&local_88,packets + uVar6,context,0,fragNdx_00);
        fVar11 = (local_88 + local_84) * 0.5;
        fVar8 = (local_88 - local_84) * 0.5 + 0.5;
        local_98.m_data[0] = fVar11 * local_78 + local_68;
        local_98.m_data[1] = fVar8 * fStack_74 + fStack_64;
        local_98.m_data[2] = (1.0 - fVar11) * fStack_70 + fStack_60;
        local_98.m_data[3] = (1.0 - fVar8) * fStack_6c + fStack_5c;
        castVectorSaturate<int>(&local_98);
        castVectorSaturate<unsigned_int>(&local_98);
        iVar2 = *(int *)&(this->super_ShaderProgram).field_0x154;
        if (iVar2 == 0x22) {
          pGVar4 = context->outputArray;
          lVar5 = (long)((iVar7 + fragNdx_00) * context->numFragmentOutputs) << 4;
          fVar8 = local_58;
          fVar11 = fStack_54;
          fVar9 = fStack_50;
          fVar10 = fStack_4c;
LAB_0069a013:
          pfVar1 = (float *)((long)&pGVar4->v + lVar5);
          *pfVar1 = fVar8;
          pfVar1[1] = fVar11;
          pfVar1[2] = fVar9;
          pfVar1[3] = fVar10;
        }
        else {
          if (iVar2 == 0x1e) {
            pGVar4 = context->outputArray;
            lVar5 = (long)((iVar7 + fragNdx_00) * context->numFragmentOutputs) << 4;
            fVar8 = local_48;
            fVar11 = fStack_44;
            fVar9 = fStack_40;
            fVar10 = fStack_3c;
            goto LAB_0069a013;
          }
          if (iVar2 == 4) {
            pGVar4 = context->outputArray;
            lVar5 = (long)((iVar7 + fragNdx_00) * context->numFragmentOutputs) << 4;
            fVar8 = local_98.m_data[0];
            fVar11 = local_98.m_data[1];
            fVar9 = local_98.m_data[2];
            fVar10 = local_98.m_data[3];
            goto LAB_0069a013;
          }
        }
        fragNdx_00 = fragNdx_00 + 1;
      } while (fragNdx_00 != 4);
      uVar6 = uVar6 + 1;
      iVar7 = iVar7 + 4;
    } while (uVar6 != (uint)numPackets);
  }
  return;
}

Assistant:

void GradientShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4	gradientMin(m_uniforms[0].value.f4);
	const tcu::Vec4	gradientMax(m_uniforms[1].value.f4);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
		const float			x		= coord.x();
		const float			y		= coord.y();
		const float			f0		= (x + y) * 0.5f;
		const float			f1		= 0.5f + (x - y) * 0.5f;
		const tcu::Vec4		fv		= Vec4(f0, f1, 1.0f-f0, 1.0f-f1);

		const tcu::Vec4		color	= gradientMin + (gradientMax-gradientMin) * fv;
		const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
		const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

		if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
		else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
		else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
		else
			DE_ASSERT(DE_FALSE);
	}
}